

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTransaction::SetTxInSequence
          (AbstractTransaction *this,uint32_t tx_in_index,uint32_t sequence)

{
  void *pvVar1;
  CfdException *this_00;
  undefined4 in_register_00000034;
  allocator local_41;
  undefined1 local_40 [32];
  
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x181,"SetTxInSequence");
  pvVar1 = this->wally_tx_pointer_;
  if ((pvVar1 != (void *)0x0) && (tx_in_index < *(uint *)((long)pvVar1 + 0x10))) {
    *(uint32_t *)(*(long *)((long)pvVar1 + 8) + 0x24 + (ulong)tx_in_index * 0xd0) = sequence;
    return;
  }
  local_40._0_8_ = "cfdcore_transaction_common.cpp";
  local_40._8_4_ = 0x187;
  local_40._16_8_ = "SetTxInSequence";
  logger::warn<>((CfdSourceLocation *)local_40,"wally invalid state.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"wally invalid state error.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::SetTxInSequence(
    uint32_t tx_in_index, uint32_t sequence) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if ((tx_pointer == nullptr) ||
      (static_cast<uint32_t>(tx_pointer->num_inputs) <= tx_in_index)) {
    warn(CFD_LOG_SOURCE, "wally invalid state.");
    throw CfdException(kCfdIllegalStateError, "wally invalid state error.");
  }
  tx_pointer->inputs[tx_in_index].sequence = sequence;
}